

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessOpDataset
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  string *this_00;
  ErrorCode EVar1;
  CommissionerAppPtr commissioner;
  CommissionerAppPtr local_c8;
  Interpreter *local_b0;
  Expression *local_a8;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  char local_88 [16];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Error local_58;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_c8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_c8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  JobManager::GetSelectedCommissioner
            (&local_58,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_c8);
  local_a0._0_4_ = local_58.mCode;
  local_98._M_p = local_88;
  local_b0 = this;
  local_a8 = aExpr;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_58.mMessage._M_dataplus._M_p,
             local_58.mMessage._M_dataplus._M_p + local_58.mMessage._M_string_length);
  this_00 = &(__return_storage_ptr__->mError).mMessage;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mError).mCode = local_a0._0_4_;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_98);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mData,(string *)&local_78);
  EVar1 = (__return_storage_ptr__->mError).mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p);
  }
  if (local_98._M_p != local_88) {
    operator_delete(local_98._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.mMessage._M_dataplus._M_p != &local_58.mMessage.field_2) {
    operator_delete(local_58.mMessage._M_dataplus._M_p);
  }
  if (EVar1 == kNone) {
    ProcessOpDatasetJob((Value *)local_a0,local_b0,&local_c8,local_a8);
    (__return_storage_ptr__->mError).mCode = local_a0._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_98);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mData,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p);
    }
    if (local_98._M_p != local_88) {
      operator_delete(local_98._M_p);
    }
  }
  if (local_c8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessOpDataset(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    value = ProcessOpDatasetJob(commissioner, aExpr);
exit:
    return value;
}